

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3ed9ed6::PKDescriptor::PKDescriptor
          (PKDescriptor *this,
          unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
          *prov,bool xonly)

{
  long in_FS_OFFSET;
  allocator<char> local_51;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  local_50;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  Vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
            (&local_50,prov);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"pk",&local_51);
  DescriptorImpl::DescriptorImpl(&this->super_DescriptorImpl,&local_50,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::~vector(&local_50);
  (this->super_DescriptorImpl).super_Descriptor._vptr_Descriptor =
       (_func_int **)&PTR__DescriptorImpl_01149fc0;
  this->m_xonly = xonly;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

PKDescriptor(std::unique_ptr<PubkeyProvider> prov, bool xonly = false) : DescriptorImpl(Vector(std::move(prov)), "pk"), m_xonly(xonly) {}